

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * kj::Path::parse(Path *__return_storage_ptr__,StringPtr path)

{
  bool bVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *in_R8;
  StringPtr path_00;
  StringPtr path_01;
  Vector<kj::String> local_70;
  Fault local_40;
  Fault f;
  bool local_22;
  DebugExpression<bool> local_21;
  undefined1 auStack_20 [7];
  DebugExpression<bool> _kjCondition;
  StringPtr path_local;
  
  _auStack_20 = (Vector<kj::String> *)path.content.ptr;
  StringPtr::StringPtr((StringPtr *)&f,"/");
  bVar1 = StringPtr::startsWith((StringPtr *)auStack_20,(StringPtr *)&f);
  local_22 = (bool)((bVar1 ^ 0xffU) & 1);
  local_21 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_22);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_21);
  sVar2 = extraout_RDX;
  if (!bVar1) {
    in_R8 = "!path.startsWith(\"/\")";
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39],kj::StringPtr&>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x39,FAILED,"!path.startsWith(\"/\")",
               "_kjCondition,\"expected a relative path, got absolute\", path",&local_21,
               (char (*) [39])"expected a relative path, got absolute",(StringPtr *)auStack_20);
    kj::_::Debug::Fault::~Fault(&local_40);
    sVar2 = extraout_RDX_00;
  }
  path_01.content.size_ = sVar2;
  path_01.content.ptr = (char *)path.content.size_;
  sVar2 = countParts((Path *)_auStack_20,path_01);
  Vector<kj::String>::Vector(&local_70,sVar2);
  path_00.content.size_ = (size_t)in_R8;
  path_00.content.ptr = (char *)path.content.size_;
  evalImpl(__return_storage_ptr__,(Path *)&local_70,_auStack_20,path_00);
  Vector<kj::String>::~Vector(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}